

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

double bson_iter_as_double(bson_iter_t *iter)

{
  size_t *psVar1;
  uint32_t *puVar2;
  byte bVar3;
  size_t sVar4;
  ulong uVar5;
  anon_struct_8_2_1ca623fe_for_v_timestamp aVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  _Bool _Var9;
  char cVar10;
  int iVar11;
  void *pvVar12;
  undefined8 uVar13;
  size_t sVar14;
  char *pcVar15;
  code *pcVar16;
  bson_oid_t *pbVar17;
  char *__s;
  size_t nbytes;
  ulong uVar18;
  uint32_t uVar19;
  long *in_RCX;
  uint8_t *puVar20;
  uint8_t *puVar21;
  ulong uVar22;
  int iVar23;
  int32_t iVar24;
  undefined4 *extraout_RDX;
  long *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var25;
  bson_t *in_RSI;
  anon_union_24_17_78d57918_for_value *dst;
  long lVar26;
  bson_json_reader_cb num_bytes;
  bson_error_t *__s_00;
  bson_t *pbVar27;
  uint uVar28;
  undefined4 extraout_XMM0_Da;
  uint32_t extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Da_27;
  undefined4 extraout_XMM0_Da_28;
  undefined4 extraout_XMM0_Da_29;
  undefined4 extraout_XMM0_Da_30;
  undefined4 extraout_XMM0_Da_31;
  undefined4 extraout_XMM0_Da_32;
  undefined4 extraout_XMM0_Da_33;
  undefined4 extraout_XMM0_Da_34;
  undefined4 extraout_XMM0_Da_35;
  undefined4 extraout_XMM0_Da_36;
  undefined4 extraout_XMM0_Da_37;
  undefined4 extraout_XMM0_Da_38;
  uint32_t extraout_XMM0_Da_39;
  uint32_t extraout_XMM0_Da_40;
  uint32_t extraout_XMM0_Da_41;
  uint32_t extraout_XMM0_Da_42;
  uint32_t extraout_XMM0_Da_43;
  uint32_t extraout_XMM0_Da_44;
  uint32_t extraout_XMM0_Da_45;
  uint32_t extraout_XMM0_Da_46;
  uint32_t extraout_XMM0_Da_47;
  uint32_t extraout_XMM0_Da_48;
  uint32_t extraout_XMM0_Da_49;
  undefined4 extraout_XMM0_Da_50;
  undefined4 extraout_XMM0_Da_51;
  undefined4 extraout_XMM0_Da_52;
  undefined4 extraout_XMM0_Da_53;
  undefined4 uVar29;
  undefined4 extraout_XMM0_Da_54;
  undefined4 extraout_XMM0_Da_55;
  undefined4 extraout_XMM0_Da_56;
  undefined4 extraout_XMM0_Da_57;
  undefined4 extraout_XMM0_Db;
  uint32_t extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  undefined4 extraout_XMM0_Db_31;
  undefined4 extraout_XMM0_Db_32;
  undefined4 extraout_XMM0_Db_33;
  undefined4 extraout_XMM0_Db_34;
  double dVar30;
  undefined4 extraout_XMM0_Db_35;
  undefined4 extraout_XMM0_Db_36;
  undefined4 extraout_XMM0_Db_37;
  undefined4 extraout_XMM0_Db_38;
  uint32_t extraout_XMM0_Db_39;
  uint32_t extraout_XMM0_Db_40;
  uint32_t uVar31;
  uint32_t extraout_XMM0_Db_41;
  uint32_t extraout_XMM0_Db_42;
  uint32_t extraout_XMM0_Db_43;
  uint32_t extraout_XMM0_Db_44;
  uint32_t extraout_XMM0_Db_45;
  uint32_t extraout_XMM0_Db_46;
  uint32_t extraout_XMM0_Db_47;
  uint32_t extraout_XMM0_Db_48;
  uint32_t extraout_XMM0_Db_49;
  undefined4 extraout_XMM0_Db_50;
  undefined4 extraout_XMM0_Db_51;
  undefined4 extraout_XMM0_Db_52;
  undefined4 extraout_XMM0_Db_53;
  undefined4 uVar32;
  undefined4 extraout_XMM0_Db_54;
  undefined4 extraout_XMM0_Db_55;
  undefined4 extraout_XMM0_Db_56;
  undefined4 extraout_XMM0_Db_57;
  bson_error_t bStack_4e0;
  uint32_t uStack_220;
  _Bool _Stack_219;
  bson_t *pbStack_218;
  uint32_t uStack_210;
  uint32_t uStack_20c;
  uint8_t *puStack_208;
  char *apcStack_200 [39];
  
  if (iter != (bson_iter_t *)0x0) {
    puVar20 = iter->raw;
    bVar3 = puVar20[iter->type];
    dVar30 = 0.0;
    if (bVar3 < 0x10) {
      if (bVar3 == 1) {
        return *(double *)(puVar20 + iter->d1);
      }
      dVar30 = 0.0;
      if ((bVar3 == 8) && (dVar30 = 0.0, puVar20[iter->d1] != '\0')) {
        return 1.0;
      }
    }
    else if (bVar3 == 0x10) {
      dVar30 = (double)*(int *)(puVar20 + iter->d1);
    }
    else if (bVar3 == 0x12) {
      return (double)*(long *)(puVar20 + iter->d1);
    }
    return dVar30;
  }
  bson_iter_as_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    bVar3 = *(byte *)((long)(((bson_json_reader_t *)iter)->producer).data +
                     (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb);
    if (bVar3 < 0x10) {
      if (bVar3 == 1) {
        return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      }
      if (bVar3 == 8) {
        return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      }
    }
    else if ((bVar3 != 0x10) && (bVar3 == 0x12)) {
      return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  bson_iter_as_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar19 = extraout_XMM0_Da_00;
    uVar31 = extraout_XMM0_Db_00;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      puVar2 = (uint32_t *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar19 = *puVar2;
      uVar31 = puVar2[1];
      uVar7 = puVar2[2];
      uVar8 = puVar2[3];
      in_RSI->flags = uVar19;
      in_RSI->len = uVar31;
      *(uint32_t *)in_RSI->padding = uVar7;
      *(uint32_t *)(in_RSI->padding + 4) = uVar8;
    }
    return (double)CONCAT44(uVar31,uVar19);
  }
  bson_iter_decimal128_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\a') {
      return (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    }
    return (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
  }
  bson_iter_oid_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\v') {
      puVar20 = puVar20 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      puVar20 = (uint8_t *)0x0;
    }
    if (in_RSI != (bson_t *)0x0) {
      *(uint8_t **)in_RSI = puVar20;
    }
    return (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      if (in_RSI != (bson_t *)0x0) {
        iVar11 = *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        iVar23 = 1;
        if (1 < iVar11) {
          iVar23 = iVar11;
        }
        in_RSI->flags = iVar23 - 1;
      }
      return (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = 0;
    }
    return (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      iVar11 = 1;
      if (1 < *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar11 = *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar28 = iVar11 - 1;
      puVar20 = puVar20 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      uVar28 = 0;
      puVar20 = (uint8_t *)0x0;
    }
    uVar29 = extraout_XMM0_Da_04;
    uVar32 = extraout_XMM0_Db_04;
    if (puVar20 != (uint8_t *)0x0) {
      pvVar12 = bson_malloc0((ulong)(uVar28 + 1));
      memcpy(pvVar12,puVar20,(ulong)uVar28);
      *(undefined1 *)((long)pvVar12 + (ulong)uVar28) = 0;
      uVar29 = extraout_XMM0_Da_05;
      uVar32 = extraout_XMM0_Db_05;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar28;
    }
    return (double)CONCAT44(uVar32,uVar29);
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\r') {
      if (in_RSI != (bson_t *)0x0) {
        iVar11 = *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        iVar23 = 1;
        if (1 < iVar11) {
          iVar23 = iVar11;
        }
        in_RSI->flags = iVar23 - 1;
      }
      return (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = 0;
    }
    return (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      if (extraout_RDX != (undefined4 *)0x0) {
        *extraout_RDX = 0;
      }
      if (in_RCX != (long *)0x0) {
        *in_RCX = 0;
      }
      goto LAB_001113f8;
    }
    if (in_RSI != (bson_t *)0x0) {
      if (*(int *)(puVar20 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
          == 0) goto LAB_001113ff;
      in_RSI->flags =
           *(int *)(puVar20 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
    }
    *extraout_RDX =
         *(undefined4 *)
          (puVar20 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
    *in_RCX = (long)(puVar20 +
                    *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
LAB_001113f8:
    return (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07);
  }
  bson_iter_codewscope_cold_2();
LAB_001113ff:
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_00 != (long *)0x0) {
      *extraout_RDX_00 = 0;
    }
    if (in_RCX != (long *)0x0) {
      *in_RCX = 0;
    }
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if (in_RSI != (bson_t *)0x0) {
        uVar19 = *(uint32_t *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        in_RSI->flags = uVar19;
        if (uVar19 != 0) {
          in_RSI->flags = uVar19 - 1;
        }
      }
      if (extraout_RDX_00 != (long *)0x0) {
        *extraout_RDX_00 =
             (long)((long)(((bson_json_reader_t *)iter)->producer).data +
                   (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
      }
      if (in_RCX != (long *)0x0) {
        *in_RCX = (long)((long)(((bson_json_reader_t *)iter)->producer).data +
                        (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
      }
    }
    return (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08);
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      iVar11 = *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar23 = 1;
      if (1 < iVar11) {
        iVar23 = iVar11;
      }
      uVar19 = iVar23 - 1;
    }
    else {
      uVar19 = 0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar19;
    }
    return (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09);
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\t') {
      return (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10);
    }
    return (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10);
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\t') {
      return (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11);
    }
    return (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar19 = 0;
    uVar13 = 0;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      uVar13 = *(undefined8 *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar19 = (uint32_t)((ulong)uVar13 >> 0x20);
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar19;
    }
    if (extraout_RDX_01 != (undefined4 *)0x0) {
      *extraout_RDX_01 = (int)uVar13;
    }
    return (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12);
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\t') {
      lVar26 = *(long *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(long *)in_RSI = lVar26 / 1000;
      *(long *)in_RSI->padding = (lVar26 % 1000) * 1000;
      return (double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13);
    }
    in_RSI->flags = 0;
    in_RSI->len = 0;
    in_RSI->padding[0] = '\0';
    in_RSI->padding[1] = '\0';
    in_RSI->padding[2] = '\0';
    in_RSI->padding[3] = '\0';
    in_RSI->padding[4] = '\0';
    in_RSI->padding[5] = '\0';
    in_RSI->padding[6] = '\0';
    in_RSI->padding[7] = '\0';
    return 0.0;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if (in_RSI != (bson_t *)0x0) {
    _Var9 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
    uVar29 = extraout_XMM0_Da_14;
    uVar32 = extraout_XMM0_Db_14;
    if (_Var9) {
      do {
        puVar20 = puStack_208;
        if (*puStack_208 != '\0') {
          sVar14 = strlen((char *)puStack_208);
          _Var9 = bson_utf8_validate((char *)puVar20,sVar14,false);
          if (!_Var9) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            uVar29 = extraout_XMM0_Da_15;
            uVar32 = extraout_XMM0_Db_15;
            break;
          }
        }
        if (*(code **)in_RSI != (code *)0x0) {
          cVar10 = (**(code **)in_RSI)(iter,puVar20,extraout_RDX_02);
          if (cVar10 != '\0') {
            return (double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16);
          }
        }
        switch(uStack_210) {
        case 1:
          pcVar16 = *(code **)(in_RSI->padding + 0x10);
          if (pcVar16 == (code *)0x0) break;
          dVar30 = bson_iter_double(iter);
          cVar10 = (*pcVar16)(SUB84(dVar30,0),iter,puVar20,extraout_RDX_02);
          uVar29 = extraout_XMM0_Da_17;
          uVar32 = extraout_XMM0_Db_17;
          goto LAB_00111ad6;
        case 2:
          pcVar15 = bson_iter_utf8(iter,(uint32_t *)apcStack_200);
          _Var9 = bson_utf8_validate(pcVar15,(ulong)apcStack_200[0] & 0xffffffff,true);
          uVar29 = extraout_XMM0_Da_25;
          uVar32 = extraout_XMM0_Db_25;
          if (!_Var9) {
LAB_00111b8c:
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            return (double)CONCAT44(uVar32,uVar29);
          }
          pcVar16 = *(code **)(in_RSI->padding + 0x18);
          goto LAB_001119f8;
        case 3:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_document(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var9 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var9) {
            pcVar16 = *(code **)(in_RSI->padding + 0x20);
            goto LAB_00111a42;
          }
          break;
        case 4:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_array(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var9 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var9) {
            pcVar16 = *(code **)(in_RSI->padding + 0x28);
            goto LAB_00111a42;
          }
          break;
        case 5:
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)((ulong)pbStack_218 & 0xffffffff00000000);
          uStack_220 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_218,&uStack_220,(uint8_t **)apcStack_200)
          ;
          if (*(code **)(in_RSI->padding + 0x30) != (code *)0x0) {
            cVar10 = (**(code **)(in_RSI->padding + 0x30))
                               (iter,puVar20,(ulong)pbStack_218 & 0xffffffff,uStack_220,
                                apcStack_200[0],extraout_RDX_02);
            uVar29 = extraout_XMM0_Da_22;
            uVar32 = extraout_XMM0_Db_22;
            goto LAB_00111ad6;
          }
          break;
        case 6:
          pcVar16 = *(code **)(in_RSI->padding + 0x38);
          goto LAB_001119ae;
        case 7:
          pcVar16 = *(code **)(in_RSI->padding + 0x40);
          if (pcVar16 != (code *)0x0) {
            pbVar17 = bson_iter_oid(iter);
LAB_00111ac7:
            cVar10 = (*pcVar16)(iter,puVar20,pbVar17,extraout_RDX_02);
            uVar29 = extraout_XMM0_Da_31;
            uVar32 = extraout_XMM0_Db_31;
            goto LAB_00111ad6;
          }
          break;
        case 8:
          pcVar16 = *(code **)(in_RSI->padding + 0x48);
          if (pcVar16 != (code *)0x0) {
            _Var9 = bson_iter_bool(iter);
            uVar28 = (uint)_Var9;
LAB_00111934:
            cVar10 = (*pcVar16)(iter,puVar20,uVar28,extraout_RDX_02);
            uVar29 = extraout_XMM0_Da_24;
            uVar32 = extraout_XMM0_Db_24;
            goto LAB_00111ad6;
          }
          break;
        case 9:
          pcVar16 = *(code **)(in_RSI->padding + 0x50);
          if (pcVar16 != (code *)0x0) {
            pbVar17 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_00111ac7;
          }
          break;
        case 10:
          pcVar16 = *(code **)(in_RSI->padding + 0x58);
LAB_001119ae:
          if (pcVar16 == (code *)0x0) break;
LAB_001119bd:
          cVar10 = (*pcVar16)(iter,puVar20,extraout_RDX_02);
          uVar29 = extraout_XMM0_Da_26;
          uVar32 = extraout_XMM0_Db_26;
          goto LAB_00111ad6;
        case 0xb:
          apcStack_200[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_200);
          sVar14 = strlen(__s);
          _Var9 = bson_utf8_validate(__s,sVar14,true);
          uVar29 = extraout_XMM0_Da_29;
          uVar32 = extraout_XMM0_Db_29;
          if (!_Var9) goto LAB_00111b8c;
          pcVar16 = *(code **)(in_RSI->padding + 0x60);
          pcVar15 = apcStack_200[0];
          if (pcVar16 == (code *)0x0) break;
          goto LAB_00111aaf;
        case 0xc:
          uStack_220 = 0;
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_220,apcStack_200,(bson_oid_t **)&pbStack_218);
          _Var9 = bson_utf8_validate(apcStack_200[0],(ulong)uStack_220,true);
          uVar29 = extraout_XMM0_Da_20;
          uVar32 = extraout_XMM0_Db_20;
          if (!_Var9) goto LAB_00111b8c;
          pcVar16 = *(code **)(in_RSI->padding + 0x68);
          pcVar15 = apcStack_200[0];
          pbVar27 = pbStack_218;
          if (pcVar16 != (code *)0x0) {
LAB_001117cc:
            cVar10 = (*pcVar16)(iter,puVar20,uStack_220,pcVar15,pbVar27,extraout_RDX_02);
            uVar29 = extraout_XMM0_Da_21;
            uVar32 = extraout_XMM0_Db_21;
            goto LAB_00111ad6;
          }
          break;
        case 0xd:
          pcVar15 = bson_iter_code(iter,(uint32_t *)apcStack_200);
          _Var9 = bson_utf8_validate(pcVar15,(ulong)apcStack_200[0] & 0xffffffff,true);
          uVar29 = extraout_XMM0_Da_23;
          uVar32 = extraout_XMM0_Db_23;
          if (!_Var9) goto LAB_00111b8c;
          pcVar16 = *(code **)(in_RSI->padding + 0x70);
          goto LAB_001119f8;
        case 0xe:
          pcVar15 = bson_iter_symbol(iter,(uint32_t *)apcStack_200);
          _Var9 = bson_utf8_validate(pcVar15,(ulong)apcStack_200[0] & 0xffffffff,true);
          uVar29 = extraout_XMM0_Da_27;
          uVar32 = extraout_XMM0_Db_27;
          if (!_Var9) goto LAB_00111b8c;
          pcVar16 = *(code **)(in_RSI + 1);
LAB_001119f8:
          if (pcVar16 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_200[0] & 0xffffffff);
LAB_00111aaf:
            cVar10 = (*pcVar16)(iter,puVar20,__s,pcVar15,extraout_RDX_02);
            uVar29 = extraout_XMM0_Da_30;
            uVar32 = extraout_XMM0_Db_30;
LAB_00111ad6:
            if (cVar10 != '\0') {
              return (double)CONCAT44(uVar32,uVar29);
            }
          }
          break;
        case 0xf:
          uStack_220 = 0;
          pbStack_218 = (bson_t *)0x0;
          uStack_20c = 0;
          pcVar15 = bson_iter_codewscope(iter,&uStack_220,&uStack_20c,(uint8_t **)&pbStack_218);
          _Var9 = bson_utf8_validate(pcVar15,(ulong)uStack_220,true);
          uVar29 = extraout_XMM0_Da_19;
          uVar32 = extraout_XMM0_Db_19;
          if (!_Var9) goto LAB_00111b8c;
          _Var9 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_20c);
          if ((_Var9) && (pcVar16 = *(code **)in_RSI[1].padding, pcVar16 != (code *)0x0)) {
            pbVar27 = (bson_t *)apcStack_200;
            goto LAB_001117cc;
          }
          break;
        case 0x10:
          pcVar16 = *(code **)(in_RSI[1].padding + 8);
          if (pcVar16 != (code *)0x0) {
            uVar28 = bson_iter_int32(iter);
            goto LAB_00111934;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_200,(uint32_t *)&pbStack_218);
          if (*(code **)(in_RSI[1].padding + 0x10) != (code *)0x0) {
            cVar10 = (**(code **)(in_RSI[1].padding + 0x10))
                               (iter,puVar20,(ulong)apcStack_200[0] & 0xffffffff,
                                (ulong)pbStack_218 & 0xffffffff,extraout_RDX_02);
            uVar29 = extraout_XMM0_Da_18;
            uVar32 = extraout_XMM0_Db_18;
            goto LAB_00111ad6;
          }
          break;
        case 0x12:
          pcVar16 = *(code **)(in_RSI[1].padding + 0x18);
          if (pcVar16 != (code *)0x0) {
            pbVar17 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_00111ac7;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_200);
          pcVar16 = *(code **)(in_RSI[1].padding + 0x38);
LAB_00111a42:
          if (pcVar16 != (code *)0x0) {
            cVar10 = (*pcVar16)(iter,puVar20,(bson_t *)apcStack_200,extraout_RDX_02);
            uVar29 = extraout_XMM0_Da_28;
            uVar32 = extraout_XMM0_Db_28;
            goto LAB_00111ad6;
          }
          break;
        default:
          if (uStack_210 == 0x7f) {
            pcVar16 = *(code **)(in_RSI[1].padding + 0x20);
          }
          else {
            if (uStack_210 != 0xff) break;
            pcVar16 = *(code **)(in_RSI[1].padding + 0x28);
          }
          if (pcVar16 == (code *)0x0) break;
          puVar20 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_001119bd;
        }
        if (*(code **)in_RSI->padding != (code *)0x0) {
          cVar10 = (**(code **)in_RSI->padding)
                             (iter,(uint8_t *)
                                   ((long)(((bson_json_reader_t *)iter)->producer).data +
                                   (ulong)*(uint32_t *)
                                           ((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4)
                                   ),extraout_RDX_02);
          if (cVar10 != '\0') {
            return (double)CONCAT44(extraout_XMM0_Db_32,extraout_XMM0_Da_32);
          }
        }
        _Var9 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
        uVar29 = extraout_XMM0_Da_33;
        uVar32 = extraout_XMM0_Db_33;
      } while (_Var9);
    }
    dVar30 = (double)CONCAT44(uVar32,uVar29);
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_219 == true) && (*(long *)(in_RSI[1].padding + 0x30) != 0)) {
        sVar14 = strlen((char *)puStack_208);
        _Var9 = bson_utf8_validate((char *)puStack_208,sVar14,false);
        uVar29 = extraout_XMM0_Da_34;
        uVar32 = extraout_XMM0_Db_34;
        if (_Var9) {
          dVar30 = (double)(**(code **)(in_RSI[1].padding + 0x30))
                                     (iter,puStack_208,uStack_210,extraout_RDX_02);
          return dVar30;
        }
      }
      dVar30 = (double)CONCAT44(uVar32,uVar29);
      if (*(code **)(in_RSI->padding + 8) != (code *)0x0) {
        dVar30 = (double)(**(code **)(in_RSI->padding + 8))(iter,extraout_RDX_02);
      }
    }
    return dVar30;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)in_RSI;
    }
    return (double)CONCAT44(extraout_XMM0_Db_35,extraout_XMM0_Da_35);
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)in_RSI;
    }
    return (double)CONCAT44(extraout_XMM0_Db_36,extraout_XMM0_Da_36);
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(bson_t **)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = in_RSI;
    }
    return (double)CONCAT44(extraout_XMM0_Db_37,extraout_XMM0_Da_37);
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db_38,extraout_XMM0_Da_38);
    }
    return (double)CONCAT44(extraout_XMM0_Db_38,extraout_XMM0_Da_38);
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar19 = extraout_XMM0_Da_39;
    uVar31 = extraout_XMM0_Db_39;
    if (puVar20[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar19 = in_RSI->flags;
      uVar31 = in_RSI->len;
      uVar7 = *(uint32_t *)in_RSI->padding;
      uVar8 = *(uint32_t *)(in_RSI->padding + 4);
      puVar2 = (uint32_t *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *puVar2 = uVar19;
      puVar2[1] = uVar31;
      puVar2[2] = uVar7;
      puVar2[3] = uVar8;
    }
    return (double)CONCAT44(uVar31,uVar19);
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if (in_RSI != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = in_RSI;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_4e0;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      iVar11 = 0;
      uVar29 = extraout_XMM0_Da_50;
      uVar32 = extraout_XMM0_Db_50;
      while( true ) {
        sVar4 = ((bson_json_reader_t *)iter)->json->pos;
        nbytes = (((bson_json_reader_t *)iter)->producer).bytes_read;
        if (nbytes == 0) {
          nbytes = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
          uVar29 = extraout_XMM0_Da_51;
          uVar32 = extraout_XMM0_Db_51;
        }
        if ((long)nbytes < 0) {
          iVar11 = -1;
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
            uVar29 = extraout_XMM0_Da_54;
            uVar32 = extraout_XMM0_Db_54;
          }
          goto LAB_00111fff;
        }
        if (nbytes == 0) goto LAB_00111fff;
        (((bson_json_reader_t *)iter)->producer).bytes_read = nbytes;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,nbytes);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar20 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar20,puVar20 + ((bson_json_reader_t *)iter)->advance,
                  nbytes - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          iVar11 = 1;
          uVar29 = extraout_XMM0_Da_55;
          uVar32 = extraout_XMM0_Db_55;
          goto LAB_00111fff;
        }
        uVar29 = extraout_XMM0_Da_52;
        uVar32 = extraout_XMM0_Db_52;
        if (((bson_json_reader_t *)iter)->error->domain != 0) break;
        uVar22 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar22 != 0xffffffffffffffff) &&
           (uVar5 = ((bson_json_reader_t *)iter)->json->pos, uVar18 = uVar5 - uVar22,
           uVar22 <= uVar5 && uVar18 != 0)) {
          if (uVar18 < nbytes) {
            nbytes = uVar18;
          }
          lVar26 = uVar22 - sVar4;
          if (lVar26 < 1) {
            lVar26 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar26,nbytes);
          uVar29 = extraout_XMM0_Da_53;
          uVar32 = extraout_XMM0_Db_53;
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        iVar11 = 1;
      }
      iVar11 = -1;
LAB_00111fff:
      if ((iVar11 == 1) && ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE)) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        uVar29 = extraout_XMM0_Da_56;
        uVar32 = extraout_XMM0_Db_56;
      }
      return (double)CONCAT44(uVar32,uVar29);
    }
    bson_json_reader_read_cold_1();
    p_Var25 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var25 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
    }
    else if ((((bson_json_reader_t *)iter)->producer).cb < p_Var25 + __n + 1) {
      uVar22 = (ulong)(p_Var25 + __n) >> 1 | (ulong)(p_Var25 + __n);
      uVar22 = uVar22 >> 2 | uVar22;
      uVar22 = uVar22 >> 4 | uVar22;
      uVar22 = uVar22 >> 8 | uVar22;
      uVar22 = uVar22 >> 0x10 | uVar22;
      num_bytes = (bson_json_reader_cb)((uVar22 >> 0x20 | uVar22) + 1);
      (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
      pvVar12 = bson_realloc((((bson_json_reader_t *)iter)->producer).data,(size_t)num_bytes);
      (((bson_json_reader_t *)iter)->producer).data = pvVar12;
    }
    memcpy((((bson_json_reader_t *)iter)->producer).dcb +
           (long)(((bson_json_reader_t *)iter)->producer).data,in_RSI,__n);
    p_Var25 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var25;
    p_Var25[(long)(((bson_json_reader_t *)iter)->producer).data] = (_func_void_void_ptr)0x0;
    return (double)CONCAT44(extraout_XMM0_Db_57,extraout_XMM0_Da_57);
  }
  puVar20 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar28 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar3 = puVar20[uVar28];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar3
  ;
  uVar19 = extraout_XMM0_Da_40;
  uVar31 = extraout_XMM0_Db_40;
  switch(bVar3) {
  case 1:
    aVar6 = (anon_struct_8_2_1ca623fe_for_v_timestamp)bson_iter_double(iter);
    uVar19 = aVar6.timestamp;
    uVar31 = aVar6.increment;
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_timestamp = aVar6;
    break;
  case 2:
    pcVar15 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    uVar19 = extraout_XMM0_Da_44;
    uVar31 = extraout_XMM0_Db_44;
    goto LAB_00111e4c;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    uVar19 = extraout_XMM0_Da_42;
    uVar31 = extraout_XMM0_Db_42;
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    uVar19 = extraout_XMM0_Da_46;
    uVar31 = extraout_XMM0_Db_46;
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    uVar19 = extraout_XMM0_Da_47;
    uVar31 = extraout_XMM0_Db_47;
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar17 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111da5;
  case 8:
    _Var9 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var9;
    uVar19 = extraout_XMM0_Da_49;
    uVar31 = extraout_XMM0_Db_49;
    break;
  case 9:
    pcVar15 = (char *)bson_iter_date_time(iter);
    uVar19 = extraout_XMM0_Da_43;
    uVar31 = extraout_XMM0_Db_43;
    goto LAB_00111e4c;
  case 0xb:
    pcVar15 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    uVar19 = extraout_XMM0_Da_48;
    uVar31 = extraout_XMM0_Db_48;
    goto LAB_00111e4c;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar17 = (bson_oid_t *)0x0;
    if (puVar20[uVar28] == '\f') {
      uVar28 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar11 = *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar11 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar11;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar20 + uVar28);
      pbVar17 = (bson_oid_t *)(puVar20 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111da5:
    bson_oid_copy(pbVar17,&dst->v_oid);
    uVar19 = extraout_XMM0_Da_45;
    uVar31 = extraout_XMM0_Db_45;
    break;
  case 0xd:
    if (puVar20[uVar28] == '\r') {
      iVar11 = 1;
      if (1 < *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar11 = *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar28 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar11 + -1;
      puVar21 = puVar20 + uVar28;
    }
    else {
      *(undefined4 *)&((bson_json_reader_t *)iter)->field_0x40 = 0;
      puVar21 = (uint8_t *)0x0;
    }
    goto LAB_00111e59;
  case 0xe:
    if (puVar20[uVar28] == '\x0e') {
      puVar21 = puVar20 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar11 = 1;
      if (1 < *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar11 = *(int *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar11 = iVar11 + -1;
    }
    else {
      puVar21 = (uint8_t *)0x0;
      iVar11 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar11;
LAB_00111e59:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar21;
    break;
  case 0xf:
    pcVar15 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    uVar19 = extraout_XMM0_Da_41;
    uVar31 = extraout_XMM0_Db_41;
    goto LAB_00111e4c;
  case 0x10:
    iVar24 = 0;
    if (puVar20[uVar28] == '\x10') {
      iVar24 = *(int32_t *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar24;
    break;
  case 0x11:
    iVar24 = 0;
    uVar13 = 0;
    if (puVar20[uVar28] == '\x11') {
      uVar13 = *(undefined8 *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar24 = (int32_t)((ulong)uVar13 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar24;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar13;
    break;
  case 0x12:
    if (puVar20[uVar28] == '\x12') {
      pcVar15 = *(char **)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar15 = (char *)0x0;
    }
LAB_00111e4c:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar15;
    break;
  case 0x13:
    if (puVar20[uVar28] == '\x13') {
      puVar2 = (uint32_t *)(puVar20 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar19 = *puVar2;
      uVar31 = puVar2[1];
      uVar7 = puVar2[2];
      uVar8 = puVar2[3];
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int32 = uVar19;
      *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = uVar31;
      *(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40 = uVar7;
      *(uint32_t *)&((bson_json_reader_t *)iter)->field_0x44 = uVar8;
    }
    break;
  default:
    if ((bVar3 != BSON_TYPE_MAXKEY) && (bVar3 != 0xff)) goto LAB_00111e61;
  }
LAB_00111e61:
  return (double)CONCAT44(uVar31,uVar19);
}

Assistant:

double
bson_iter_as_double (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);

   switch ((int) ITER_TYPE (iter)) {
   case BSON_TYPE_BOOL:
      return (double) bson_iter_bool (iter);
   case BSON_TYPE_DOUBLE:
      return bson_iter_double (iter);
   case BSON_TYPE_INT32:
      return (double) bson_iter_int32 (iter);
   case BSON_TYPE_INT64:
      return (double) bson_iter_int64 (iter);
   default:
      return 0;
   }
}